

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O1

string * __thiscall
ObjectsContext::MaybeEncryptString
          (string *__return_storage_ptr__,ObjectsContext *this,string *inString)

{
  pointer pcVar1;
  bool bVar2;
  
  if ((this->mEncryptionHelper != (EncryptionHelper *)0x0) &&
     (bVar2 = EncryptionHelper::IsEncrypting(this->mEncryptionHelper), bVar2)) {
    EncryptionHelper::EncryptString(__return_storage_ptr__,this->mEncryptionHelper,inString);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (inString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + inString->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectsContext::MaybeEncryptString(const std::string& inString) {
	if (IsEncrypting())
		return mEncryptionHelper->EncryptString(inString);
	else
		return inString;
}